

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::AMFImporter::Find_ConvertedNode
          (AMFImporter *this,string *pID,list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList,
          aiNode **pNode)

{
  aiNode *paVar1;
  int iVar2;
  _List_node_base *p_Var3;
  size_t __n;
  allocator local_459;
  undefined1 *local_458;
  ulong local_450;
  undefined1 local_448 [24];
  undefined1 local_430 [1024];
  
  std::__cxx11::string::string((string *)&local_458,(pID->_M_dataplus)._M_p,&local_459);
  __n = 0x3ff;
  if ((local_450 & 0xfffffc00) == 0) {
    __n = local_450 & 0xffffffff;
  }
  memcpy(local_430,local_458,__n);
  local_430[__n] = 0;
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  p_Var3 = (pNodeList->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    if (p_Var3 == (_List_node_base *)pNodeList) {
      return false;
    }
    paVar1 = (aiNode *)p_Var3[1]._M_next;
    if (((paVar1->mName).length == (ai_uint32)__n) &&
       (iVar2 = bcmp((paVar1->mName).data,local_430,__n), iVar2 == 0)) break;
    p_Var3 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
  }
  if (pNode == (aiNode **)0x0) {
    return true;
  }
  *pNode = paVar1;
  return true;
}

Assistant:

bool AMFImporter::Find_ConvertedNode(const std::string& pID, std::list<aiNode*>& pNodeList, aiNode** pNode) const
{
aiString node_name(pID.c_str());

	for(aiNode* node: pNodeList)
	{
		if(node->mName == node_name)
		{
			if(pNode != nullptr) *pNode = node;

			return true;
		}
	}// for(aiNode* node: pNodeList)

	return false;
}